

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O3

void StoreTrivialContextMap
               (EncodeContextMapArena *arena,size_t num_types,size_t context_bits,HuffmanTree *tree,
               size_t *storage_ix,uint8_t *storage)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  
  StoreVarLenUint8(num_types - 1,storage_ix,storage);
  if (1 < num_types) {
    lVar1 = context_bits - 1;
    uVar6 = (context_bits + num_types) - 1;
    switchD_012e5a64::default(arena,0,uVar6 * 4);
    uVar8 = *storage_ix;
    *(ulong *)(storage + (uVar8 >> 3)) = (ulong)storage[uVar8 >> 3] | 1L << ((byte)uVar8 & 7);
    uVar9 = uVar8 + 1;
    *storage_ix = uVar9;
    *(size_t *)(storage + (uVar9 >> 3)) =
         context_bits - 2 << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
    *storage_ix = uVar8 + 5;
    arena->histogram[context_bits - 1] = (uint32_t)num_types;
    arena->histogram[0] = 1;
    auVar4 = _DAT_01da0bd0;
    auVar3 = _DAT_01d9fb10;
    auVar2 = _DAT_01d9fb00;
    if (context_bits < uVar6) {
      lVar7 = num_types - 2;
      auVar10._8_4_ = (int)lVar7;
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar9 = 0;
      auVar10 = auVar10 ^ _DAT_01d9fb10;
      do {
        auVar12._8_4_ = (int)uVar9;
        auVar12._0_8_ = uVar9;
        auVar12._12_4_ = (int)(uVar9 >> 0x20);
        auVar13 = (auVar12 | auVar2) ^ auVar3;
        iVar11 = auVar10._4_4_;
        if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                    iVar11 < auVar13._4_4_) & 1)) {
          arena->histogram[context_bits + uVar9] = 1;
        }
        if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
            auVar13._12_4_ <= auVar10._12_4_) {
          arena->histogram[context_bits + uVar9 + 1] = 1;
        }
        auVar12 = (auVar12 | auVar4) ^ auVar3;
        iVar14 = auVar12._4_4_;
        if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar12._0_4_ <= auVar10._0_4_)) {
          arena->histogram[context_bits + uVar9 + 2] = 1;
          arena->histogram[context_bits + uVar9 + 3] = 1;
        }
        uVar9 = uVar9 + 4;
      } while ((num_types + 2 & 0xfffffffffffffffc) != uVar9);
    }
    BuildAndStoreHuffmanTree
              (arena->histogram,uVar6,uVar6,tree,arena->depths,arena->bits,storage_ix,storage);
    uVar9 = *storage_ix;
    sVar5 = 0;
    do {
      lVar7 = sVar5 + lVar1;
      if (sVar5 == 0) {
        lVar7 = 0;
      }
      uVar6 = arena->depths[lVar7] + uVar9;
      *(ulong *)(storage + (uVar9 >> 3)) =
           (ulong)arena->bits[lVar7] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
      *storage_ix = uVar6;
      uVar8 = arena->depths[context_bits - 1] + uVar6;
      *(ulong *)(storage + (uVar6 >> 3)) =
           (ulong)arena->bits[context_bits - 1] << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
      *storage_ix = uVar8;
      *(ulong *)(storage + (uVar8 >> 3)) =
           (ulong)(uint)~(-1 << ((byte)lVar1 & 0x1f)) << ((byte)uVar8 & 7) |
           (ulong)storage[uVar8 >> 3];
      uVar9 = uVar8 + lVar1;
      *storage_ix = uVar9;
      sVar5 = sVar5 + 1;
    } while (num_types != sVar5);
    *(ulong *)(storage + (uVar9 >> 3)) = (ulong)storage[uVar9 >> 3] | 1L << ((byte)uVar9 & 7);
    *storage_ix = uVar8 + context_bits;
  }
  return;
}

Assistant:

static void StoreTrivialContextMap(EncodeContextMapArena* arena,
                                   size_t num_types,
                                   size_t context_bits,
                                   HuffmanTree* tree,
                                   size_t* storage_ix,
                                   uint8_t* storage) {
  StoreVarLenUint8(num_types - 1, storage_ix, storage);
  if (num_types > 1) {
    size_t repeat_code = context_bits - 1u;
    size_t repeat_bits = (1u << repeat_code) - 1u;
    size_t alphabet_size = num_types + repeat_code;
    uint32_t* BROTLI_RESTRICT const histogram = arena->histogram;
    uint8_t* BROTLI_RESTRICT const depths = arena->depths;
    uint16_t* BROTLI_RESTRICT const bits = arena->bits;
    size_t i;
    memset(histogram, 0, alphabet_size * sizeof(histogram[0]));
    /* Write RLEMAX. */
    BrotliWriteBits(1, 1, storage_ix, storage);
    BrotliWriteBits(4, repeat_code - 1, storage_ix, storage);
    histogram[repeat_code] = (uint32_t)num_types;
    histogram[0] = 1;
    for (i = context_bits; i < alphabet_size; ++i) {
      histogram[i] = 1;
    }
    BuildAndStoreHuffmanTree(histogram, alphabet_size, alphabet_size,
                             tree, depths, bits, storage_ix, storage);
    for (i = 0; i < num_types; ++i) {
      size_t code = (i == 0 ? 0 : i + context_bits - 1);
      BrotliWriteBits(depths[code], bits[code], storage_ix, storage);
      BrotliWriteBits(
          depths[repeat_code], bits[repeat_code], storage_ix, storage);
      BrotliWriteBits(repeat_code, repeat_bits, storage_ix, storage);
    }
    /* Write IMTF (inverse-move-to-front) bit. */
    BrotliWriteBits(1, 1, storage_ix, storage);
  }
}